

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O1

void __thiscall
sparse_parameters::sparse_parameters(sparse_parameters *this,size_t length,uint32_t stride_shift)

{
  float *pfVar1;
  
  (this->_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_map)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->_map)._M_h._M_rehash_policy = 0;
  (this->_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_map)._M_h._M_element_count = 0;
  (this->_map)._M_h._M_buckets = &(this->_map)._M_h._M_single_bucket;
  (this->_map)._M_h._M_bucket_count = 1;
  (this->_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->_weight_mask = (length << ((byte)stride_shift & 0x3f)) - 1;
  this->_stride_shift = stride_shift;
  this->_seeded = false;
  this->_delete = false;
  this->default_data = (void *)0x0;
  this->fun = (_func_void_weight_ptr_void_ptr *)0x0;
  pfVar1 = calloc_or_throw<float>((ulong)(uint)(1 << ((byte)stride_shift & 0x1f)));
  this->default_value = pfVar1;
  return;
}

Assistant:

sparse_parameters(size_t length, uint32_t stride_shift = 0)
      : _map()
      , _weight_mask((length << stride_shift) - 1)
      , _stride_shift(stride_shift)
      , _seeded(false)
      , _delete(false)
      , default_data(nullptr)
      , fun(nullptr)
  {
    default_value = calloc_mergable_or_throw<weight>(stride());
  }